

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest_Extensions_Test::
~GeneratedMessageReflectionSwapTest_Extensions_Test
          (GeneratedMessageReflectionSwapTest_Extensions_Test *this)

{
  protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_Extensions_Test::
  ~GeneratedMessageReflectionSwapTest_Extensions_Test
            ((GeneratedMessageReflectionSwapTest_Extensions_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, Extensions) {
  unittest::TestAllExtensions lhs;
  unittest::TestAllExtensions rhs;

  TestUtil::SetAllExtensions(&lhs);

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectExtensionsClear(lhs);
  TestUtil::ExpectAllExtensionsSet(rhs);
}